

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extpubkey.cpp
# Opt level: O0

void __thiscall ExtPubkey_GetPubkeyAddress_Test::TestBody(ExtPubkey_GetPubkeyAddress_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  AssertHelper local_a08;
  Message local_a00;
  string local_9f8;
  undefined1 local_9d8 [8];
  AssertionResult gtest_ar_17;
  Message local_9c0;
  string local_9b8;
  undefined1 local_998 [8];
  AssertionResult gtest_ar_16;
  Message local_980;
  string local_978;
  undefined1 local_958 [8];
  AssertionResult gtest_ar_15;
  Message local_940;
  string local_938;
  undefined1 local_918 [8];
  AssertionResult gtest_ar_14;
  Message local_900;
  size_type local_8f8;
  int local_8ec;
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar_13;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addrs3;
  Message local_8b8;
  string local_8b0;
  undefined1 local_890 [8];
  AssertionResult gtest_ar_12;
  Address addr3;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> el_list;
  Message local_6e0;
  string local_6d8;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar_11;
  Message local_6a0;
  string local_698;
  undefined1 local_678 [8];
  AssertionResult gtest_ar_10;
  Message local_660;
  string local_658;
  undefined1 local_638 [8];
  AssertionResult gtest_ar_9;
  Message local_620;
  string local_618;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_8;
  Message local_5e0;
  size_type local_5d8;
  int local_5cc;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar_7;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addrs2;
  Message local_598;
  string local_590;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_6;
  Address addr2;
  Message local_3d8;
  string local_3d0;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_5;
  Message local_398;
  string local_390;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_4;
  Message local_358;
  string local_350;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_3;
  Message local_318;
  string local_310;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_2;
  Message local_2d8;
  size_type local_2d0;
  int local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_1;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addrs1;
  Message local_290;
  string local_288;
  undefined1 local_268 [8];
  AssertionResult gtest_ar;
  Address addr1;
  ExtPubkey pubkey;
  allocator local_31;
  undefined1 local_30 [8];
  string ext_base58;
  ExtPubkey_GetPubkeyAddress_Test *this_local;
  
  ext_base58.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::ExtPubkey::ExtPubkey
            ((ExtPubkey *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)local_30);
  cfd::core::Extkey::GetPubkeyAddress
            ((Address *)&gtest_ar.message_,
             (Extkey *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             kWitnessUnknown,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kCustomChain);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_288,(Address *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[43],std::__cxx11::string>
            ((EqHelper<false> *)local_268,"\"tb1qgrys9hdcsunfh5qklzj85e6qev9v5gmsyl4tfv\"",
             "addr1.GetAddress()",(char (*) [43])"tb1qgrys9hdcsunfh5qklzj85e6qev9v5gmsyl4tfv",
             &local_288);
  std::__cxx11::string::~string((string *)&local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &addrs1.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xda,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &addrs1.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_290);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &addrs1.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  cfd::core::Extkey::GetPubkeyAddresses
            ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)&gtest_ar_1.message_
             ,(Extkey *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kCustomChain);
  local_2c4 = 4;
  local_2d0 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::size
                        ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                         &gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_2c0,"4","addrs1.size()",&local_2c4,&local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xdc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  sVar3 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::size
                    ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                     &gtest_ar_1.message_);
  if (sVar3 == 4) {
    pvVar4 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                       ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                        &gtest_ar_1.message_,0);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_310,pvVar4);
    testing::internal::EqHelper<false>::Compare<char[43],std::__cxx11::string>
              ((EqHelper<false> *)local_2f0,"\"tb1qgrys9hdcsunfh5qklzj85e6qev9v5gmsyl4tfv\"",
               "addrs1[0].GetAddress()",(char (*) [43])"tb1qgrys9hdcsunfh5qklzj85e6qev9v5gmsyl4tfv",
               &local_310);
    std::__cxx11::string::~string((string *)&local_310);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
    if (!bVar1) {
      testing::Message::Message(&local_318);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xdf,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_318);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_318);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
    pvVar4 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                       ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                        &gtest_ar_1.message_,1);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_350,pvVar4);
    testing::internal::EqHelper<false>::Compare<char[63],std::__cxx11::string>
              ((EqHelper<false> *)local_330,
               "\"tb1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfs5wcm3n\"",
               "addrs1[1].GetAddress()",
               (char (*) [63])"tb1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfs5wcm3n",
               &local_350);
    std::__cxx11::string::~string((string *)&local_350);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
    if (!bVar1) {
      testing::Message::Message(&local_358);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xe1,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_358);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_358);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
    pvVar4 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                       ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                        &gtest_ar_1.message_,2);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_390,pvVar4);
    testing::internal::EqHelper<false>::Compare<char[36],std::__cxx11::string>
              ((EqHelper<false> *)local_370,"\"2N9E4zD7TeFFuHTvzuVVvVSpmKq2DwGevP6\"",
               "addrs1[2].GetAddress()",(char (*) [36])"2N9E4zD7TeFFuHTvzuVVvVSpmKq2DwGevP6",
               &local_390);
    std::__cxx11::string::~string((string *)&local_390);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
    if (!bVar1) {
      testing::Message::Message(&local_398);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xe3,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_398);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_398);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
    pvVar4 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                       ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                        &gtest_ar_1.message_,3);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_3d0,pvVar4);
    testing::internal::EqHelper<false>::Compare<char[35],std::__cxx11::string>
              ((EqHelper<false> *)local_3b0,"\"mmRWLqKULV2s5o1j42FhB6ZhdscGmqSRH2\"",
               "addrs1[3].GetAddress()",(char (*) [35])"mmRWLqKULV2s5o1j42FhB6ZhdscGmqSRH2",
               &local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
    if (!bVar1) {
      testing::Message::Message(&local_3d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xe5,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &local_3d8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      testing::Message::~Message(&local_3d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  }
  cfd::core::Extkey::GetPubkeyAddress
            ((Address *)&gtest_ar_6.message_,
             (Extkey *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             kWitnessUnknown,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kRegtest);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_590,(Address *)&gtest_ar_6.message_);
  testing::internal::EqHelper<false>::Compare<char[45],std::__cxx11::string>
            ((EqHelper<false> *)local_570,"\"bcrt1qgrys9hdcsunfh5qklzj85e6qev9v5gmsxkvx79\"",
             "addr2.GetAddress()",(char (*) [45])"bcrt1qgrys9hdcsunfh5qklzj85e6qev9v5gmsxkvx79",
             &local_590);
  std::__cxx11::string::~string((string *)&local_590);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar1) {
    testing::Message::Message(&local_598);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &addrs2.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xeb,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &addrs2.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_598);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &addrs2.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  cfd::core::Extkey::GetPubkeyAddresses
            ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)&gtest_ar_7.message_
             ,(Extkey *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kRegtest);
  local_5cc = 4;
  local_5d8 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::size
                        ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                         &gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_5c8,"4","addrs1.size()",&local_5cc,&local_5d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xed,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
  sVar3 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::size
                    ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                     &gtest_ar_7.message_);
  if (sVar3 == 4) {
    pvVar4 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                       ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                        &gtest_ar_7.message_,0);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_618,pvVar4);
    testing::internal::EqHelper<false>::Compare<char[45],std::__cxx11::string>
              ((EqHelper<false> *)local_5f8,"\"bcrt1qgrys9hdcsunfh5qklzj85e6qev9v5gmsxkvx79\"",
               "addrs2[0].GetAddress()",
               (char (*) [45])"bcrt1qgrys9hdcsunfh5qklzj85e6qev9v5gmsxkvx79",&local_618);
    std::__cxx11::string::~string((string *)&local_618);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
    if (!bVar1) {
      testing::Message::Message(&local_620);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xf0,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_620);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_620);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
    pvVar4 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                       ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                        &gtest_ar_7.message_,1);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_658,pvVar4);
    testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
              ((EqHelper<false> *)local_638,
               "\"bcrt1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfsehjayf\"",
               "addrs2[1].GetAddress()",
               (char (*) [65])"bcrt1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfsehjayf",
               &local_658);
    std::__cxx11::string::~string((string *)&local_658);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
    if (!bVar1) {
      testing::Message::Message(&local_660);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_638);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xf2,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_660);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_660);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
    pvVar4 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                       ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                        &gtest_ar_7.message_,2);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_698,pvVar4);
    testing::internal::EqHelper<false>::Compare<char[36],std::__cxx11::string>
              ((EqHelper<false> *)local_678,"\"2N9E4zD7TeFFuHTvzuVVvVSpmKq2DwGevP6\"",
               "addrs2[2].GetAddress()",(char (*) [36])"2N9E4zD7TeFFuHTvzuVVvVSpmKq2DwGevP6",
               &local_698);
    std::__cxx11::string::~string((string *)&local_698);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
    if (!bVar1) {
      testing::Message::Message(&local_6a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_678);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xf4,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_6a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
      testing::Message::~Message(&local_6a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
    pvVar4 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                       ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                        &gtest_ar_7.message_,3);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_6d8,pvVar4);
    testing::internal::EqHelper<false>::Compare<char[35],std::__cxx11::string>
              ((EqHelper<false> *)local_6b8,"\"mmRWLqKULV2s5o1j42FhB6ZhdscGmqSRH2\"",
               "addrs2[3].GetAddress()",(char (*) [35])"mmRWLqKULV2s5o1j42FhB6ZhdscGmqSRH2",
               &local_6d8);
    std::__cxx11::string::~string((string *)&local_6d8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
    if (!bVar1) {
      testing::Message::Message(&local_6e0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &el_list.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xf6,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &el_list.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_6e0);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &el_list.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_6e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  }
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Extkey::GetPubkeyAddress
            ((Address *)&gtest_ar_12.message_,
             (Extkey *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             kP2pkhAddress,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &addr3.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             kElementsRegtest);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_8b0,(Address *)&gtest_ar_12.message_);
  testing::internal::EqHelper<false>::Compare<char[36],std::__cxx11::string>
            ((EqHelper<false> *)local_890,"\"2dfLJSJHCNrVWVYJU63ZDJeKFgRZEuxc1JQ\"",
             "addr3.GetAddress()",(char (*) [36])"2dfLJSJHCNrVWVYJU63ZDJeKFgRZEuxc1JQ",&local_8b0);
  std::__cxx11::string::~string((string *)&local_8b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_890);
  if (!bVar1) {
    testing::Message::Message(&local_8b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_890);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &addrs3.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xfe,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &addrs3.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_8b8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &addrs3.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_8b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_890);
  cfd::core::Extkey::GetPubkeyAddresses
            ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
             &gtest_ar_13.message_,
             (Extkey *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &addr3.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             kElementsRegtest);
  local_8ec = 4;
  local_8f8 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::size
                        ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                         &gtest_ar_13.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_8e8,"4","addrs3.size()",&local_8ec,&local_8f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e8);
  if (!bVar1) {
    testing::Message::Message(&local_900);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x102,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_900);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_900);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
  sVar3 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::size
                    ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                     &gtest_ar_13.message_);
  if (sVar3 == 4) {
    pvVar4 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                       ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                        &gtest_ar_13.message_,0);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_938,pvVar4);
    testing::internal::EqHelper<false>::Compare<char[44],std::__cxx11::string>
              ((EqHelper<false> *)local_918,"\"ert1qgrys9hdcsunfh5qklzj85e6qev9v5gms7zecq9\"",
               "addrs3[0].GetAddress()",(char (*) [44])"ert1qgrys9hdcsunfh5qklzj85e6qev9v5gms7zecq9"
               ,&local_938);
    std::__cxx11::string::~string((string *)&local_938);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_918);
    if (!bVar1) {
      testing::Message::Message(&local_940);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_918);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0x105,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_940);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
      testing::Message::~Message(&local_940);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_918);
    pvVar4 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                       ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                        &gtest_ar_13.message_,1);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_978,pvVar4);
    testing::internal::EqHelper<false>::Compare<char[64],std::__cxx11::string>
              ((EqHelper<false> *)local_958,
               "\"ert1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfsgy6rdd\"",
               "addrs3[1].GetAddress()",
               (char (*) [64])"ert1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfsgy6rdd",
               &local_978);
    std::__cxx11::string::~string((string *)&local_978);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_958);
    if (!bVar1) {
      testing::Message::Message(&local_980);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_958);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0x107,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_980);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
      testing::Message::~Message(&local_980);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_958);
    pvVar4 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                       ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                        &gtest_ar_13.message_,2);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_9b8,pvVar4);
    testing::internal::EqHelper<false>::Compare<char[35],std::__cxx11::string>
              ((EqHelper<false> *)local_998,"\"XTL5r53bjRBtL24WwjCMpGtaAnr5wmHkXL\"",
               "addrs3[2].GetAddress()",(char (*) [35])"XTL5r53bjRBtL24WwjCMpGtaAnr5wmHkXL",
               &local_9b8);
    std::__cxx11::string::~string((string *)&local_9b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_998);
    if (!bVar1) {
      testing::Message::Message(&local_9c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_998);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0x109,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_9c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
      testing::Message::~Message(&local_9c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_998);
    pvVar4 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                       ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                        &gtest_ar_13.message_,3);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_9f8,pvVar4);
    testing::internal::EqHelper<false>::Compare<char[36],std::__cxx11::string>
              ((EqHelper<false> *)local_9d8,"\"2dfLJSJHCNrVWVYJU63ZDJeKFgRZEuxc1JQ\"",
               "addrs3[3].GetAddress()",(char (*) [36])"2dfLJSJHCNrVWVYJU63ZDJeKFgRZEuxc1JQ",
               &local_9f8);
    std::__cxx11::string::~string((string *)&local_9f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d8);
    if (!bVar1) {
      testing::Message::Message(&local_a00);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9d8);
      testing::internal::AssertHelper::AssertHelper
                (&local_a08,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0x10b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a08,&local_a00);
      testing::internal::AssertHelper::~AssertHelper(&local_a08);
      testing::Message::~Message(&local_a00);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_9d8);
  }
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
            ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
             &gtest_ar_13.message_);
  cfd::core::Address::~Address((Address *)&gtest_ar_12.message_);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &addr3.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
            ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)&gtest_ar_7.message_
            );
  cfd::core::Address::~Address((Address *)&gtest_ar_6.message_);
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
            ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)&gtest_ar_1.message_
            );
  cfd::core::Address::~Address((Address *)&gtest_ar.message_);
  cfd::core::ExtPubkey::~ExtPubkey
            ((ExtPubkey *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ExtPubkey, GetPubkeyAddress) {
  std::string ext_base58 = "tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua";

  ExtPubkey pubkey(ext_base58);
  auto addr1 = pubkey.GetPubkeyAddress();
  EXPECT_EQ("tb1qgrys9hdcsunfh5qklzj85e6qev9v5gmsyl4tfv",
    addr1.GetAddress());
  auto addrs1 = pubkey.GetPubkeyAddresses();
  EXPECT_EQ(4, addrs1.size());
  if (addrs1.size() == 4) {
    EXPECT_EQ("tb1qgrys9hdcsunfh5qklzj85e6qev9v5gmsyl4tfv",
      addrs1[0].GetAddress());
    EXPECT_EQ("tb1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfs5wcm3n",
      addrs1[1].GetAddress());
    EXPECT_EQ("2N9E4zD7TeFFuHTvzuVVvVSpmKq2DwGevP6",
      addrs1[2].GetAddress());
    EXPECT_EQ("mmRWLqKULV2s5o1j42FhB6ZhdscGmqSRH2",
      addrs1[3].GetAddress());
  }

  auto addr2 = pubkey.GetPubkeyAddress(
      AddressType::kWitnessUnknown, nullptr, NetType::kRegtest);
  EXPECT_EQ("bcrt1qgrys9hdcsunfh5qklzj85e6qev9v5gmsxkvx79",
    addr2.GetAddress());
  auto addrs2 = pubkey.GetPubkeyAddresses(nullptr, NetType::kRegtest);
  EXPECT_EQ(4, addrs1.size());
  if (addrs2.size() == 4) {
    EXPECT_EQ("bcrt1qgrys9hdcsunfh5qklzj85e6qev9v5gmsxkvx79",
      addrs2[0].GetAddress());
    EXPECT_EQ("bcrt1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfsehjayf",
      addrs2[1].GetAddress());
    EXPECT_EQ("2N9E4zD7TeFFuHTvzuVVvVSpmKq2DwGevP6",
      addrs2[2].GetAddress());
    EXPECT_EQ("mmRWLqKULV2s5o1j42FhB6ZhdscGmqSRH2",
      addrs2[3].GetAddress());
  }

#ifndef CFD_DISABLE_ELEMENTS
  auto el_list = cfd::core::GetElementsAddressFormatList();
  auto addr3 = pubkey.GetPubkeyAddress(AddressType::kP2pkhAddress,
      &el_list, NetType::kElementsRegtest);
  EXPECT_EQ("2dfLJSJHCNrVWVYJU63ZDJeKFgRZEuxc1JQ",
    addr3.GetAddress());

  auto addrs3 = pubkey.GetPubkeyAddresses(
      &el_list, NetType::kElementsRegtest);
  EXPECT_EQ(4, addrs3.size());
  if (addrs3.size() == 4) {
    EXPECT_EQ("ert1qgrys9hdcsunfh5qklzj85e6qev9v5gms7zecq9",
      addrs3[0].GetAddress());
    EXPECT_EQ("ert1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfsgy6rdd",
      addrs3[1].GetAddress());
    EXPECT_EQ("XTL5r53bjRBtL24WwjCMpGtaAnr5wmHkXL",
      addrs3[2].GetAddress());
    EXPECT_EQ("2dfLJSJHCNrVWVYJU63ZDJeKFgRZEuxc1JQ",
      addrs3[3].GetAddress());
  }
#endif  // CFD_DISABLE_ELEMENTS
}